

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O3

int asn1_template_ex_i2d
              (ASN1_VALUE **pval,uchar **out,ASN1_TEMPLATE *tt,int tag,int iclass,int optional)

{
  OPENSSL_STACK *sk;
  ASN1_ITEM *it;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ASN1_VALUE *orig_ptr;
  void *orig_ptr_00;
  long lVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t *p;
  ASN1_VALUE *skitem;
  ASN1_VALUE *local_68;
  void *local_60;
  uchar **local_58;
  ASN1_ITEM *local_50;
  int local_48;
  uint local_44;
  ASN1_VALUE *local_40;
  ASN1_VALUE *local_38;
  
  if ((iclass & 0xffffff3fU) != 0) {
    __assert_fail("(iclass & ASN1_TFLG_TAG_CLASS) == iclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf0,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  if (iclass != 0 && tag == -1) {
    __assert_fail("tag != -1 || iclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf2,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar3 = tt->flags;
  if ((uVar3 & 0x18) == 0) {
    uVar1 = 0;
    if (tag != -1) {
      uVar1 = iclass;
    }
  }
  else {
    if (tag != -1) {
      iVar4 = 0xc1;
      iVar8 = 0xfa;
      goto LAB_0020a057;
    }
    tag = tt->tag;
    uVar1 = uVar3 & 0xc0;
  }
  if (((byte)uVar3 & optional != 0) == 1) {
    __assert_fail("!optional || (flags & ASN1_TFLG_OPTIONAL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x10d,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar2 = (uint)(optional != 0 || (uVar3 & 1) != 0);
  if ((uVar3 & 6) == 0) {
    if ((uVar3 & 0x10) == 0) {
      iVar4 = asn1_item_ex_i2d_opt(pval,out,tt->item,tag,uVar1,uVar2);
      return iVar4;
    }
    local_60 = (void *)CONCAT44(local_60._4_4_,uVar1);
    iVar4 = asn1_item_ex_i2d_opt(pval,(uchar **)0x0,tt->item,-1,0,uVar2);
    if (0 < iVar4) {
      iVar8 = ASN1_object_size(1,iVar4,tag);
      if ((out != (uchar **)0x0) && (iVar8 != -1)) {
        ASN1_put_object(out,1,iVar4,tag,(int)local_60);
        iVar4 = ASN1_item_ex_i2d((ASN1_VALUE **)pval,out,(ASN1_ITEM *)tt->item,-1,0);
        if (iVar4 < 0) {
          return -1;
        }
      }
      return iVar8;
    }
    return iVar4;
  }
  sk = (OPENSSL_STACK *)*pval;
  if (sk != (OPENSSL_STACK *)0x0) {
    iVar4 = 0x10;
    local_58 = out;
    if (((uVar3 & 2) != 0) && (iVar4 = 0x11, (uVar3 & 4) != 0)) {
      __assert_fail("(flags & ASN1_TFLG_SEQUENCE_OF) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0x126,
                    "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                   );
    }
    bVar11 = (uVar3 & 0x10) == 0;
    iVar8 = 0;
    if (tag != -1 && bVar11) {
      iVar4 = tag;
    }
    local_50 = (ASN1_ITEM *)CONCAT44(local_50._4_4_,iVar4);
    local_60 = (void *)CONCAT44(local_60._4_4_,uVar1);
    local_44 = 0;
    if (tag != -1 && bVar11) {
      local_44 = uVar1;
    }
    local_48 = tag;
    sVar5 = OPENSSL_sk_num(sk);
    if (sVar5 != 0) {
      iVar8 = 0;
      sVar5 = 0;
      do {
        local_40 = (ASN1_VALUE *)OPENSSL_sk_value(sk,sVar5);
        uVar1 = ASN1_item_ex_i2d(&local_40,(uchar **)0x0,(ASN1_ITEM *)tt->item,-1,0);
        if (uVar1 == 0xffffffff) {
          return -1;
        }
        if ((int)(uVar1 ^ 0x7fffffff) < iVar8) {
          return -1;
        }
        iVar8 = iVar8 + uVar1;
        sVar5 = sVar5 + 1;
        sVar6 = OPENSSL_sk_num(sk);
      } while (sVar5 < sVar6);
    }
    uVar1 = ASN1_object_size(1,iVar8,(int)local_50);
    if (uVar1 == 0xffffffff) {
      return -1;
    }
    if ((uVar3 & 0x10) == 0) {
      uVar2 = uVar1;
      if (local_58 == (uchar **)0x0) {
        return uVar1;
      }
    }
    else {
      uVar2 = ASN1_object_size(1,uVar1,local_48);
      if (local_58 == (uchar **)0x0) {
        return uVar2;
      }
      if (uVar2 == 0xffffffff) {
        return -1;
      }
      ASN1_put_object(local_58,1,uVar1,local_48,(int)local_60);
    }
    ASN1_put_object(local_58,1,iVar8,(int)local_50,local_44);
    local_50 = (ASN1_ITEM *)tt->item;
    if (((uVar3 & 2) == 0) || (sVar5 = OPENSSL_sk_num(sk), sVar5 < 2)) {
      sVar5 = OPENSSL_sk_num(sk);
      it = local_50;
      if (sVar5 == 0) {
        return uVar2;
      }
      sVar5 = 0;
      do {
        local_68 = (ASN1_VALUE *)OPENSSL_sk_value(sk,sVar5);
        uVar3 = ASN1_item_ex_i2d(&local_68,local_58,it,-1,0);
        if ((int)uVar3 < 0) break;
        sVar5 = sVar5 + 1;
        sVar6 = OPENSSL_sk_num(sk);
      } while (sVar5 < sVar6);
      uVar3 = ~uVar3 >> 0x1f;
    }
    else {
      orig_ptr = (ASN1_VALUE *)OPENSSL_malloc((long)iVar8);
      sVar5 = OPENSSL_sk_num(sk);
      orig_ptr_00 = OPENSSL_calloc(sVar5,0x10);
      uVar3 = 0;
      local_68 = orig_ptr;
      if ((orig_ptr_00 != (void *)0x0) && (orig_ptr != (ASN1_VALUE *)0x0)) {
        local_60 = orig_ptr_00;
        sVar5 = OPENSSL_sk_num(sk);
        if (sVar5 != 0) {
          piVar9 = (int *)((long)local_60 + 8);
          sVar5 = 0;
          do {
            local_38 = (ASN1_VALUE *)OPENSSL_sk_value(sk,sVar5);
            *(ASN1_VALUE **)(piVar9 + -2) = local_68;
            iVar4 = ASN1_item_ex_i2d(&local_38,(uchar **)&local_68,local_50,-1,0);
            *piVar9 = iVar4;
            if (iVar4 < 0) {
              uVar3 = 0;
              orig_ptr_00 = local_60;
              goto LAB_0020a4c9;
            }
            if ((long)iVar8 < (long)local_68 - (long)orig_ptr) {
              __assert_fail("p - buf <= skcontlen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                            ,0x1b0,
                            "int asn1_set_seq_out(struct stack_st_ASN1_VALUE *, unsigned char **, int, const ASN1_ITEM *, int)"
                           );
            }
            sVar5 = sVar5 + 1;
            sVar6 = OPENSSL_sk_num(sk);
            piVar9 = piVar9 + 4;
          } while (sVar5 < sVar6);
        }
        sVar5 = OPENSSL_sk_num(sk);
        orig_ptr_00 = local_60;
        qsort(local_60,sVar5,0x10,der_cmp);
        local_68 = (ASN1_VALUE *)*local_58;
        sVar5 = OPENSSL_sk_num(sk);
        if (sVar5 != 0) {
          piVar9 = (int *)((long)orig_ptr_00 + 8);
          uVar10 = 0;
          do {
            if ((long)*piVar9 == 0) {
              lVar7 = 0;
            }
            else {
              memcpy(local_68,*(void **)(piVar9 + -2),(long)*piVar9);
              lVar7 = (long)*piVar9;
            }
            local_68 = local_68 + lVar7;
            uVar10 = uVar10 + 1;
            sVar5 = OPENSSL_sk_num(sk);
            piVar9 = piVar9 + 4;
          } while (uVar10 < sVar5);
        }
        *local_58 = (uchar *)local_68;
        uVar3 = 1;
      }
LAB_0020a4c9:
      OPENSSL_free(orig_ptr_00);
      OPENSSL_free(orig_ptr);
    }
    return uVar2 | -(uint)(uVar3 == 0);
  }
  if (uVar2 != 0) {
    return 0;
  }
  iVar4 = 0x9b;
  iVar8 = 0x11e;
LAB_0020a057:
  ERR_put_error(0xc,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                ,iVar8);
  return -1;
}

Assistant:

static int asn1_template_ex_i2d(ASN1_VALUE **pval, unsigned char **out,
                                const ASN1_TEMPLATE *tt, int tag, int iclass,
                                int optional) {
  int i, ret, ttag, tclass;
  size_t j;
  uint32_t flags = tt->flags;

  // Historically, |iclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((iclass & ASN1_TFLG_TAG_CLASS) == iclass);
  // If not overridding the tag, |iclass| is ignored and should be zero.
  assert(tag != -1 || iclass == 0);

  // Work out tag and class to use: tagging may come either from the
  // template or the arguments, not both because this would create
  // ambiguity.
  if (flags & ASN1_TFLG_TAG_MASK) {
    // Error if argument and template tagging
    if (tag != -1) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
    }
    // Get tagging from template
    ttag = tt->tag;
    tclass = flags & ASN1_TFLG_TAG_CLASS;
  } else if (tag != -1) {
    // No template tagging, get from arguments
    ttag = tag;
    tclass = iclass & ASN1_TFLG_TAG_CLASS;
  } else {
    ttag = -1;
    tclass = 0;
  }

  // The template may itself by marked as optional, or this may be the template
  // of an |ASN1_ITEM_TEMPLATE| type which was contained inside an outer
  // optional template. (They cannot both be true because the
  // |ASN1_ITEM_TEMPLATE| codepath rejects optional templates.)
  assert(!optional || (flags & ASN1_TFLG_OPTIONAL) == 0);
  optional = optional || (flags & ASN1_TFLG_OPTIONAL) != 0;

  // At this point 'ttag' contains the outer tag to use, and 'tclass' is the
  // class.

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    int isset, sktag, skaclass;
    int skcontlen, sklen;
    ASN1_VALUE *skitem;

    if (!*pval) {
      if (optional) {
        return 0;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
      return -1;
    }

    if (flags & ASN1_TFLG_SET_OF) {
      isset = 1;
      // Historically, types with both bits set were mutated when
      // serialized to apply the sort. We no longer support this.
      assert((flags & ASN1_TFLG_SEQUENCE_OF) == 0);
    } else {
      isset = 0;
    }

    // Work out inner tag value: if EXPLICIT or no tagging use underlying
    // type.
    if ((ttag != -1) && !(flags & ASN1_TFLG_EXPTAG)) {
      sktag = ttag;
      skaclass = tclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (isset) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }

    // Determine total length of items
    skcontlen = 0;
    for (j = 0; j < sk_ASN1_VALUE_num(sk); j++) {
      int tmplen;
      skitem = sk_ASN1_VALUE_value(sk, j);
      tmplen = ASN1_item_ex_i2d(&skitem, NULL, ASN1_ITEM_ptr(tt->item), -1, 0);
      if (tmplen == -1 || (skcontlen > INT_MAX - tmplen)) {
        return -1;
      }
      skcontlen += tmplen;
    }
    sklen = ASN1_object_size(/*constructed=*/1, skcontlen, sktag);
    if (sklen == -1) {
      return -1;
    }
    // If EXPLICIT need length of surrounding tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ret = ASN1_object_size(/*constructed=*/1, sklen, ttag);
    } else {
      ret = sklen;
    }

    if (!out || ret == -1) {
      return ret;
    }

    // Now encode this lot...
    // EXPLICIT tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ASN1_put_object(out, /*constructed=*/1, sklen, ttag, tclass);
    }
    // SET or SEQUENCE and IMPLICIT tag
    ASN1_put_object(out, /*constructed=*/1, skcontlen, sktag, skaclass);
    // And the stuff itself
    if (!asn1_set_seq_out(sk, out, skcontlen, ASN1_ITEM_ptr(tt->item), isset)) {
      return -1;
    }
    return ret;
  }

  if (flags & ASN1_TFLG_EXPTAG) {
    // EXPLICIT tagging
    // Find length of tagged item
    i = asn1_item_ex_i2d_opt(pval, NULL, ASN1_ITEM_ptr(tt->item), -1, 0,
                             optional);
    if (i <= 0) {
      return i;
    }
    // Find length of EXPLICIT tag
    ret = ASN1_object_size(/*constructed=*/1, i, ttag);
    if (out && ret != -1) {
      // Output tag and item
      ASN1_put_object(out, /*constructed=*/1, i, ttag, tclass);
      if (ASN1_item_ex_i2d(pval, out, ASN1_ITEM_ptr(tt->item), -1, 0) < 0) {
        return -1;
      }
    }
    return ret;
  }

  // Either normal or IMPLICIT tagging
  return asn1_item_ex_i2d_opt(pval, out, ASN1_ITEM_ptr(tt->item), ttag, tclass,
                              optional);
}